

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O1

void __thiscall llvm::DWARFGdbIndex::dumpTUList(DWARFGdbIndex *this,raw_ostream *OS)

{
  ulong uVar1;
  uint uVar2;
  unsigned_long *puVar3;
  long lVar4;
  StringRef Fmt;
  StringRef Fmt_00;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>
  local_100;
  tuple<llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  local_80;
  raw_ostream *local_40;
  _func_int **local_38;
  
  local_80.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
  _M_head_impl.Item = (unsigned_long *)&this->TuListOffset;
  local_80.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>.
  super__Head_base<3UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
  _M_head_impl.Item =
       (unsigned_long *)
       (ulong)(this->TuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>.
              super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
              super_SmallVectorBase.Size;
  local_80.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>.
  super__Head_base<3UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
  _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01098918;
  local_80.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
  .super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
  _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01098948;
  Fmt.Length = 0x32;
  Fmt.Data = "\n  Types CU list offset = {0:x}, has {1} entries:\n";
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
  ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
                    *)&local_100,Fmt,
                   (tuple<llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
                    *)&local_80);
  local_40 = OS;
  raw_ostream::operator<<(OS,&local_100.super_formatv_object_base);
  if (local_100.super_formatv_object_base.Replacements.
      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super_formatv_object_base.Replacements.
                    super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.super_formatv_object_base.Replacements.
                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super_formatv_object_base.Replacements.
                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super_formatv_object_base.Adapters.
      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super_formatv_object_base.Adapters.
                    super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.super_formatv_object_base.Adapters.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super_formatv_object_base.Adapters.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar1 = (ulong)(this->TuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>.
                 super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>.
                 super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar1 != 0) {
    puVar3 = (unsigned_long *)
             (this->TuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>.
             super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>.
             super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
             super_SmallVectorBase.BeginX;
    lVar4 = uVar1 * 0x18;
    uVar2 = 0;
    local_38 = (_func_int **)&PTR_anchor_010989a8;
    do {
      local_80.
      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
      _M_head_impl.Item = puVar3 + 1;
      local_80.
      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>.
      super__Head_base<3UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
      _M_head_impl.Item = puVar3 + 2;
      local_80.
      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>.
      super__Head_base<3UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
      _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01098978;
      local_80.
      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
      _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01098978;
      local_80.
      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
      _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01098978;
      local_80.
      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>.
      _M_head_impl.super_format_adapter._vptr_format_adapter = local_38;
      Fmt_00.Length = 0x49;
      Fmt_00.Data = "    {0}: offset = {1:x8}, type_offset = {2:x8}, type_signature = {3:x16}\n";
      local_80.
      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .
      super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_false>.
      _M_head_impl.Item = puVar3;
      local_80.
      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>
      .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>.
      _M_head_impl.Item = uVar2;
      formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>,_llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>
      ::formatv_object(&local_100,Fmt_00,&local_80);
      raw_ostream::operator<<(local_40,&local_100.super_formatv_object_base);
      if (local_100.super_formatv_object_base.Replacements.
          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.super_formatv_object_base.Replacements.
                        super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.super_formatv_object_base.Replacements.
                              super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.super_formatv_object_base.Replacements.
                              super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_100.super_formatv_object_base.Adapters.
          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.super_formatv_object_base.Adapters.
                        super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.super_formatv_object_base.Adapters.
                              super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.super_formatv_object_base.Adapters.
                              super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      puVar3 = puVar3 + 3;
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpTUList(raw_ostream &OS) const {
  OS << formatv("\n  Types CU list offset = {0:x}, has {1} entries:\n",
                TuListOffset, TuList.size());
  uint32_t I = 0;
  for (const TypeUnitEntry &TU : TuList)
    OS << formatv("    {0}: offset = {1:x8}, type_offset = {2:x8}, "
                  "type_signature = {3:x16}\n",
                  I++, TU.Offset, TU.TypeOffset, TU.TypeSignature);
}